

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O3

void Js::CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
               (JavascriptString *s,CharCount startIndex,CharCount appendCharLength,
               Builder<256U> *toString,bool appendChars)

{
  char16 c;
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  undefined4 *puVar5;
  char16 *pcVar6;
  JavascriptString *s_00;
  char16_t *pcVar7;
  char16_t *pcVar8;
  undefined7 in_register_00000081;
  uint uVar9;
  char16_t *pcVar10;
  void *local_50;
  void *packedSubstringInfo;
  void *packedSubstringInfo2;
  CharCount local_38;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000081,appendChars);
  if (s == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x429,"(s)","s");
    if (!bVar3) goto LAB_00d42fb1;
    *puVar5 = 0;
  }
  cVar4 = JavascriptString::GetLength(s);
  if (cVar4 < startIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42a,"(startIndex <= s->GetLength())",
                                "startIndex <= s->GetLength()");
    if (!bVar3) goto LAB_00d42fb1;
    *puVar5 = 0;
  }
  cVar4 = JavascriptString::GetLength(s);
  if (cVar4 - startIndex < appendCharLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42b,"(appendCharLength <= s->GetLength() - startIndex)",
                                "appendCharLength <= s->GetLength() - startIndex");
    if (!bVar3) goto LAB_00d42fb1;
    *puVar5 = 0;
  }
  if (toString == (Builder<256U> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42c,"(toString)","toString");
    if (!bVar3) goto LAB_00d42fb1;
    *puVar5 = 0;
  }
  if (toString->isFinalized == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42d,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar3) goto LAB_00d42fb1;
    *puVar5 = 0;
  }
  if (((char)local_34 != '\0') && (toString->directCharLength != 0xffffffff)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42f,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                                "!(appendChars && !toString->HasOnlyDirectChars())");
    if (!bVar3) {
LAB_00d42fb1:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (appendCharLength == 0) {
    return;
  }
  bVar3 = Phases::IsEnabled((Phases *)&DAT_015b6718,StringConcatPhase);
  if (bVar3) {
    uVar9 = 8;
    if (appendCharLength < 8) {
      uVar9 = appendCharLength;
    }
    packedSubstringInfo2 = toString;
    local_38 = appendCharLength;
    pcVar6 = JavascriptString::UnsafeGetBuffer(s);
    pcVar8 = L"";
    pcVar10 = L"";
    if (pcVar6 != (char16 *)0x0) {
      pcVar6 = JavascriptString::GetString(s);
      pcVar10 = pcVar6 + startIndex;
    }
    pcVar6 = JavascriptString::UnsafeGetBuffer(s);
    appendCharLength = local_38;
    if (pcVar6 == (char16 *)0x0) {
      pcVar8 = L"...";
    }
    if (8 < local_38) {
      pcVar8 = L"...";
    }
    pcVar7 = L"false";
    if ((char)local_34 != '\0') {
      pcVar7 = L"true";
    }
    Output::Print(L"CompoundString::AppendGeneric(JavascriptString *s = \"%.*s%s\", startIndex = %u, appendCharLength = %u, appendChars = %s)\n"
                  ,(ulong)uVar9,pcVar10,pcVar8,(ulong)startIndex,(ulong)local_38,pcVar7);
    Output::Flush();
    toString = (Builder<256U> *)packedSubstringInfo2;
  }
  if ((char)local_34 == '\0') {
    if (toString->directCharLength == 0xffffffff) {
      if (appendCharLength == 1) goto LAB_00d42ee6;
      bVar3 = Block::ShouldAppendChars(appendCharLength,8);
      if (bVar3) {
        pcVar6 = JavascriptString::GetString(s);
        pcVar6 = pcVar6 + startIndex;
        bVar3 = TryAppendFewCharsGeneric<Js::CompoundString::Builder<256u>>
                          (pcVar6,appendCharLength,toString);
        goto LAB_00d42e4d;
      }
      Builder<256U>::SwitchToPointerMode(toString);
    }
    else if (appendCharLength == 1) {
      pJVar1 = (toString->scriptContext->super_ScriptContextBase).javascriptLibrary;
      pcVar6 = JavascriptString::GetString(s);
      s_00 = CharStringCache::GetStringForChar(&pJVar1->charStringCache,pcVar6[startIndex]);
      bVar3 = TryAppendGeneric<Js::CompoundString::Builder<256u>>(s_00,1,toString);
      if (bVar3) {
        return;
      }
      Builder<256U>::AppendSlow(toString,s_00);
      return;
    }
    PackSubstringInfo(startIndex,appendCharLength,&local_50,&packedSubstringInfo);
    bVar3 = TryAppendGeneric<Js::CompoundString::Builder<256u>>
                      (s,local_50,packedSubstringInfo,appendCharLength,toString);
    if (!bVar3) {
      Builder<256U>::AppendSlow(toString,s,local_50,packedSubstringInfo,appendCharLength);
    }
  }
  else {
    if (appendCharLength != 1) {
      pcVar6 = JavascriptString::GetString(s);
      pcVar6 = pcVar6 + startIndex;
      bVar3 = TryAppendGeneric<Js::CompoundString::Builder<256u>>(pcVar6,appendCharLength,toString);
LAB_00d42e4d:
      if (bVar3 != false) {
        return;
      }
      Builder<256U>::AppendSlow(toString,pcVar6,appendCharLength);
      return;
    }
LAB_00d42ee6:
    pcVar6 = JavascriptString::GetString(s);
    c = pcVar6[startIndex];
    bVar3 = TryAppendGeneric<Js::CompoundString::Builder<256u>>(c,toString);
    if (!bVar3) {
      Builder<256U>::AppendSlow(toString,c);
      return;
    }
  }
  return;
}

Assistant:

inline void CompoundString::AppendGeneric(
        JavascriptString *const s,
        const CharCount startIndex,
        const CharCount appendCharLength,
        String *const toString,
        const bool appendChars)
    {
        Assert(s);
        Assert(startIndex <= s->GetLength());
        Assert(appendCharLength <= s->GetLength() - startIndex);
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(!(appendChars && !toString->HasOnlyDirectChars()));

        if(appendCharLength == 0)
            return;

        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("CompoundString::AppendGeneric(JavascriptString *s = \"%.*s%s\", startIndex = %u, appendCharLength = %u, appendChars = %s)\n"),
                min(static_cast<CharCount>(8), appendCharLength),
                s->IsFinalized() ? &s->GetString()[startIndex] : _u(""),
                !s->IsFinalized() || appendCharLength > 8 ? _u("...") : _u(""),
                startIndex,
                appendCharLength,
                appendChars ? _u("true") : _u("false"));
            Output::Flush();
        }

        if(appendChars || toString->HasOnlyDirectChars())
        {
            if(appendCharLength == 1)
            {
                const char16 c = toString->GetAppendStringBuffer(s)[startIndex];
                if(TryAppendGeneric(c, toString))
                    return;
                toString->AppendSlow(c);
                return;
            }

            if(appendChars || Block::ShouldAppendChars(appendCharLength, sizeof(void *)))
            {
                const char16 *const appendBuffer = &toString->GetAppendStringBuffer(s)[startIndex];
                if(appendChars
                        ? TryAppendGeneric(appendBuffer, appendCharLength, toString)
                        : TryAppendFewCharsGeneric(appendBuffer, appendCharLength, toString))
                {
                    return;
                }
                toString->AppendSlow(appendBuffer, appendCharLength);
                return;
            }

            toString->SwitchToPointerMode();
        }

        if(appendCharLength == 1)
        {
            JavascriptString *const js =
                toString->GetLibrary()->GetCharStringCache().GetStringForChar(toString->GetAppendStringBuffer(s)[startIndex]);
            if(TryAppendGeneric(js, 1, toString))
                return;
            toString->AppendSlow(js);
            return;
        }

        void *packedSubstringInfo, *packedSubstringInfo2;
        PackSubstringInfo(startIndex, appendCharLength, &packedSubstringInfo, &packedSubstringInfo2);
        if(TryAppendGeneric(s, packedSubstringInfo, packedSubstringInfo2, appendCharLength, toString))
            return;
        toString->AppendSlow(s, packedSubstringInfo, packedSubstringInfo2, appendCharLength);
    }